

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O2

Token __thiscall slang::syntax::SyntaxNode::childToken(SyntaxNode *this,size_t index)

{
  ConstTokenOrSyntax child;
  ConstTokenOrSyntax local_30;
  Token local_18;
  
  getChild(&local_30,this,index);
  if (local_30.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      _M_index == '\0') {
    local_18 = ConstTokenOrSyntax::token(&local_30);
  }
  else {
    parsing::Token::Token(&local_18);
  }
  return local_18;
}

Assistant:

parsing::Token SyntaxNode::childToken(size_t index) const {
    auto child = getChild(index);
    if (!child.isToken())
        return Token();
    return child.token();
}